

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemFilter.h
# Opt level: O3

bool __thiscall Assimp::FileSystemFilter::Exists(FileSystemFilter *this,char *pFile)

{
  int iVar1;
  _Alloc_hider _Var2;
  string tmp;
  allocator<char> local_31;
  string local_30;
  
  if (this->mWrapped == (IOSystem *)0x0) {
    __assert_fail("nullptr != mWrapped",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/FileSystemFilter.h"
                  ,0x67,"virtual bool Assimp::FileSystemFilter::Exists(const char *) const");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,pFile,&local_31);
  _Var2._M_p = local_30._M_dataplus._M_p;
  if (local_30._M_string_length == (this->mSrc_file)._M_string_length) {
    if (local_30._M_string_length == 0) goto LAB_00349832;
    iVar1 = bcmp(local_30._M_dataplus._M_p,(this->mSrc_file)._M_dataplus._M_p,
                 local_30._M_string_length);
    if (iVar1 == 0) goto LAB_00349832;
  }
  BuildPath(this,&local_30);
  Cleanup(this,&local_30);
  _Var2._M_p = local_30._M_dataplus._M_p;
LAB_00349832:
  iVar1 = (*this->mWrapped->_vptr_IOSystem[2])(this->mWrapped,_Var2._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return SUB41(iVar1,0);
}

Assistant:

bool Exists( const char* pFile) const {
        ai_assert( nullptr != mWrapped );
        
        std::string tmp = pFile;

        // Currently this IOSystem is also used to open THE ONE FILE.
        if (tmp != mSrc_file)    {
            BuildPath(tmp);
            Cleanup(tmp);
        }

        return mWrapped->Exists(tmp);
    }